

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModel.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::LinkedModelFile::CopyFrom(LinkedModelFile *this,LinkedModelFile *from)

{
  if (from != this) {
    if (this->linkedmodelfilename_ != (StringParameter *)0x0) {
      (*(this->linkedmodelfilename_->super_MessageLite)._vptr_MessageLite[1])();
    }
    this->linkedmodelfilename_ = (StringParameter *)0x0;
    if (this->linkedmodelsearchpath_ != (StringParameter *)0x0) {
      (*(this->linkedmodelsearchpath_->super_MessageLite)._vptr_MessageLite[1])();
    }
    this->linkedmodelsearchpath_ = (StringParameter *)0x0;
    MergeFrom(this,from);
    return;
  }
  return;
}

Assistant:

void LinkedModelFile::CopyFrom(const LinkedModelFile& from) {
// @@protoc_insertion_point(class_specific_copy_from_start:CoreML.Specification.LinkedModelFile)
  if (&from == this) return;
  Clear();
  MergeFrom(from);
}